

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

bool __thiscall
iutest::detail::PairMatcher<iutest::detail::GtMatcher<int>,int>::
CheckElem<int,iutest::detail::GtMatcher<int>>
          (PairMatcher<iutest::detail::GtMatcher<int>,int> *this,int *actual,GtMatcher<int> *matcher
          )

{
  bool bVar1;
  GtMatcher<int> *this_00;
  AssertionResult local_48;
  GtMatcher<int> *local_20;
  GtMatcher<int> *matcher_local;
  int *actual_local;
  PairMatcher<iutest::detail::GtMatcher<int>,_int> *this_local;
  
  local_20 = matcher;
  matcher_local = (GtMatcher<int> *)actual;
  actual_local = (int *)this;
  this_00 = CastToMatcher<iutest::detail::GtMatcher<int>>
                      (matcher,(type **)&iutest_type_traits::enabler_t<void>::value);
  GtMatcher<int>::operator()(&local_48,this_00,(int *)matcher_local);
  bVar1 = AssertionResult::operator_cast_to_bool(&local_48);
  AssertionResult::~AssertionResult(&local_48);
  return bVar1;
}

Assistant:

bool CheckElem(const T& actual, U& matcher)
    {
        return static_cast<bool>(CastToMatcher(matcher)(actual));
    }